

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

void __thiscall QString::resize(QString *this,qsizetype newSize,QChar fillChar)

{
  char16_t *__value;
  qsizetype qVar1;
  longlong in_RSI;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  qsizetype difference;
  qsizetype oldSize;
  qsizetype in_stack_ffffffffffffffb8;
  QString *in_stack_ffffffffffffffc0;
  QArrayDataPointer<char16_t> *__first;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __first = in_RDI;
  __value = (char16_t *)size((QString *)in_RDI);
  resize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  qVar1 = size((QString *)in_RDI);
  if (0 < qVar1 - (long)__value) {
    QArrayDataPointer<char16_t>::data(in_RDI);
    QChar::unicode(&local_a);
    std::fill_n<char16_t*,long_long,char16_t>((char16_t *)__first,in_RSI,__value);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QString::resize(qsizetype newSize, QChar fillChar)
{
    const qsizetype oldSize = size();
    resize(newSize);
    const qsizetype difference = size() - oldSize;
    if (difference > 0)
        std::fill_n(d.data() + oldSize, difference, fillChar.unicode());
}